

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qmdisubwindow.cpp
# Opt level: O2

void QMdiSubWindow::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  undefined8 *puVar2;
  undefined4 uVar3;
  undefined4 in_register_00000034;
  
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      windowStateChanged((QMdiSubWindow *)_o,
                         (QFlagsStorageHelper<Qt::WindowState,_4>)
                         ((QFlagsStorageHelper<Qt::WindowState,_4> *)_a[1])->
                         super_QFlagsStorage<Qt::WindowState>,
                         (QFlagsStorageHelper<Qt::WindowState,_4>)
                         ((QFlagsStorageHelper<Qt::WindowState,_4> *)_a[2])->
                         super_QFlagsStorage<Qt::WindowState>);
      return;
    case 1:
      aboutToActivate((QMdiSubWindow *)_o);
      return;
    case 2:
      showSystemMenu((QMdiSubWindow *)_o);
      return;
    case 3:
      showShaded((QMdiSubWindow *)_o);
      return;
    case 4:
      QMdiSubWindowPrivate::_q_updateStaysOnTopHint(*(QMdiSubWindowPrivate **)(_o + 8));
      return;
    case 5:
      QMdiSubWindowPrivate::_q_enterInteractiveMode(*(QMdiSubWindowPrivate **)(_o + 8));
      return;
    case 6:
      QMdiSubWindowPrivate::_q_processFocusChanged
                (*(QMdiSubWindowPrivate **)(_o + 8),(QWidget *)CONCAT44(in_register_00000034,_c),
                 *_a[2]);
      return;
    }
    break;
  case ReadProperty:
    if (_id == 1) {
      uVar3 = *(undefined4 *)(*(long *)(_o + 8) + 0x2e4);
    }
    else {
      if (_id != 0) {
        return;
      }
      uVar3 = *(undefined4 *)(*(long *)(_o + 8) + 0x2e0);
    }
    *(undefined4 *)*_a = uVar3;
    break;
  case WriteProperty:
    if (_id == 1) {
      *(undefined4 *)(*(long *)(_o + 8) + 0x2e4) = **_a;
    }
    else if (_id == 0) {
      *(undefined4 *)(*(long *)(_o + 8) + 0x2e0) = **_a;
    }
    break;
  case IndexOfMethod:
    bVar1 = QtMocHelpers::
            indexOfMethod<void(QMdiSubWindow::*)(QFlags<Qt::WindowState>,QFlags<Qt::WindowState>)>
                      ((QtMocHelpers *)_a,(void **)windowStateChanged,0,0);
    if (!bVar1) {
      QtMocHelpers::indexOfMethod<void(QMdiSubWindow::*)()>
                ((QtMocHelpers *)_a,(void **)aboutToActivate,0,1);
      return;
    }
    break;
  case RegisterMethodArgumentMetaType:
    if (_id == 6) {
      puVar2 = (undefined8 *)*_a;
      if (*_a[1] < 2) {
        *puVar2 = &QtPrivate::QMetaTypeInterfaceWrapper<QWidget_*>::metaType;
        return;
      }
    }
    else {
      puVar2 = (undefined8 *)*_a;
    }
    *puVar2 = 0;
  }
  return;
}

Assistant:

void QMdiSubWindow::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QMdiSubWindow *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->windowStateChanged((*reinterpret_cast< std::add_pointer_t<Qt::WindowStates>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<Qt::WindowStates>>(_a[2]))); break;
        case 1: _t->aboutToActivate(); break;
        case 2: _t->showSystemMenu(); break;
        case 3: _t->showShaded(); break;
        case 4: _t->d_func()->_q_updateStaysOnTopHint(); break;
        case 5: _t->d_func()->_q_enterInteractiveMode(); break;
        case 6: _t->d_func()->_q_processFocusChanged((*reinterpret_cast< std::add_pointer_t<QWidget*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QWidget*>>(_a[2]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 6:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 1:
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QWidget* >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QMdiSubWindow::*)(Qt::WindowStates , Qt::WindowStates )>(_a, &QMdiSubWindow::windowStateChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QMdiSubWindow::*)()>(_a, &QMdiSubWindow::aboutToActivate, 1))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<int*>(_v) = _t->keyboardSingleStep(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->keyboardPageStep(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setKeyboardSingleStep(*reinterpret_cast<int*>(_v)); break;
        case 1: _t->setKeyboardPageStep(*reinterpret_cast<int*>(_v)); break;
        default: break;
        }
    }
}